

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

ActionResultHolder<unsigned_char> *
testing::internal::ActionResultHolder<unsigned_char>::
PerformDefaultAction<unsigned_char(unsigned_short)>
          (FunctionMockerBase<unsigned_char_(unsigned_short)> *func_mocker,type args,
          string *call_description)

{
  Result RVar1;
  ActionResultHolder<unsigned_char> *pAVar2;
  
  pAVar2 = (ActionResultHolder<unsigned_char> *)operator_new(0x10);
  RVar1 = FunctionMockerBase<unsigned_char_(unsigned_short)>::PerformDefaultAction
                    (func_mocker,args,call_description);
  (pAVar2->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__UntypedActionResultHolderBase_00195d40;
  (pAVar2->result_).value_ = RVar1;
  return pAVar2;
}

Assistant:

static ActionResultHolder* PerformDefaultAction(
      const FunctionMockerBase<F>* func_mocker,
      typename RvalueRef<typename Function<F>::ArgumentTuple>::type args,
      const std::string& call_description) {
    return new ActionResultHolder(Wrapper(func_mocker->PerformDefaultAction(
        internal::move(args), call_description)));
  }